

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O1

void __thiscall CLIntercept::initCustomPerfCounters(CLIntercept *this)

{
  string *metricSetSymbolName;
  string *metricsFileName;
  ofstream *os;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool includeMaxValues;
  uint32_t adapterIndex;
  bool bVar2;
  char cVar3;
  MDHelper *pMVar4;
  long lVar5;
  double __x;
  double __x_00;
  double __x_01;
  string fileName;
  string permissionString;
  allocator local_71;
  string local_70;
  string local_50;
  
  if (this->m_pMDHelper != (MDHelper *)0x0) goto LAB_0019a283;
  adapterIndex = (this->m_Config).DevicePerfCounterAdapterIndex;
  includeMaxValues = (this->m_Config).DevicePerfCounterReportMax;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar2 = OS::Services::CheckMDAPIPermissions(&this->m_OS,&local_50);
  if (!bVar2) {
    log(this,__x);
  }
  metricSetSymbolName = &(this->m_Config).DevicePerfCounterCustom;
  metricsFileName = &(this->m_Config).DevicePerfCounterFile;
  if ((this->m_Config).DevicePerfCounterEventBasedSampling == true) {
    pMVar4 = MetricsDiscovery::MDHelper::CreateEBS
                       (&(this->m_Config).DevicePerfCounterLibName,metricSetSymbolName,
                        metricsFileName,adapterIndex,includeMaxValues);
LAB_0019a1f6:
    this->m_pMDHelper = pMVar4;
  }
  else if ((this->m_Config).DevicePerfCounterTimeBasedSampling == true) {
    pMVar4 = MetricsDiscovery::MDHelper::CreateTBS
                       (&(this->m_Config).DevicePerfCounterLibName,metricSetSymbolName,
                        metricsFileName,adapterIndex,includeMaxValues);
    goto LAB_0019a1f6;
  }
  if (this->m_pMDHelper == (MDHelper *)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Metric Discovery failed to initialize.\n","");
    log(this,__x_01);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Metric Discovery initialized.\n","");
    log(this,__x_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
LAB_0019a283:
  if (this->m_pMDHelper != (MDHelper *)0x0) {
    if ((this->m_Config).DevicePerfCounterTimeBasedSampling == true) {
      MetricsDiscovery::MDHelper::OpenStream
                (this->m_pMDHelper,(this->m_Config).DevicePerfCounterTimeBasedSamplingPeriod * 1000,
                 (this->m_Config).DevicePerfCounterTimeBasedBufferSize,0);
    }
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      std::__cxx11::string::string((string *)&local_50,sc_DumpDirectoryName,&local_71);
      OS::Services_Common::GetDumpDirectoryName
                (&(this->m_OS).super_Services_Common,&local_50,&local_70);
      paVar1 = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__cxx11::string::push_back((char)&local_70);
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::_M_append
                ((char *)&local_70,(ulong)(this->m_Config).DevicePerfCounterCustom._M_dataplus._M_p)
      ;
      std::__cxx11::string::append((char *)&local_70);
      lVar5 = std::__cxx11::string::find((char *)&local_70,0x19e01b,0);
      lVar5 = std::__cxx11::string::find((char *)&local_70,0x19e01b,lVar5 + 1);
      if (lVar5 != -1) {
        do {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
          mkdir(local_50._M_dataplus._M_p,0x1ff);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          lVar5 = std::__cxx11::string::find((char *)&local_70,0x19e01b,lVar5 + 1);
        } while (lVar5 != -1);
      }
      if ((this->m_Config).UniqueFiles == true) {
        Utils::GetUniqueFileName(&local_50,&local_70);
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      os = &this->m_MetricDump;
      std::ofstream::open((char *)os,(_Ios_Openmode)local_70._M_dataplus._M_p);
      MetricsDiscovery::MDHelper::PrintMetricNames(this->m_pMDHelper,(ostream *)os);
      MetricsDiscovery::MDHelper::PrintMetricUnits(this->m_pMDHelper,(ostream *)os);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void CLIntercept::initCustomPerfCounters()
{
    const std::string& metricSetSymbolName = config().DevicePerfCounterCustom;
    const std::string& metricsFileName = config().DevicePerfCounterFile;
    uint32_t adapterIndex = config().DevicePerfCounterAdapterIndex;
    bool includeMaxValues = config().DevicePerfCounterReportMax;

    if( m_pMDHelper == NULL )
    {
        std::string permissionString;
        if( OS().CheckMDAPIPermissions(permissionString) == false )
        {
            log( permissionString );
        }

        if( config().DevicePerfCounterEventBasedSampling )
        {
            m_pMDHelper = MetricsDiscovery::MDHelper::CreateEBS(
                config().DevicePerfCounterLibName,
                metricSetSymbolName,
                metricsFileName,
                adapterIndex,
                includeMaxValues );
        }
        else if( config().DevicePerfCounterTimeBasedSampling )
        {
            m_pMDHelper = MetricsDiscovery::MDHelper::CreateTBS(
                config().DevicePerfCounterLibName,
                metricSetSymbolName,
                metricsFileName,
                adapterIndex,
                includeMaxValues );
        }
        else
        {
            CLI_ASSERT( 0 );
        }
        if( m_pMDHelper )
        {
            log( "Metric Discovery initialized.\n" );
        }
        else
        {
            log( "Metric Discovery failed to initialize.\n" );
        }
    }

    if( m_pMDHelper )
    {
        // Open the metric stream for time based sampling, if needed.
        if( config().DevicePerfCounterTimeBasedSampling )
        {
            uint32_t    timerNS =
                config().DevicePerfCounterTimeBasedSamplingPeriod * 1000;
            uint32_t    bufferSizeBytes =
                config().DevicePerfCounterTimeBasedBufferSize;
            m_pMDHelper->OpenStream(
                timerNS,        // timer period, in nanoseconds
                bufferSizeBytes,// buffer size in bytes, 0 = device maximum
                0 );            // pid -> sample all processes
        }

        // Get the dump directory name and create the dump file for
        // metrics, if we haven't created it already.
        if ( !m_MetricDump.is_open() )
        {
            std::string fileName = "";
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
            fileName += '/';
            fileName += sc_PerfCountersFileNamePrefix;
            fileName += "_";
            fileName += metricSetSymbolName;
            fileName += ".csv";

            OS().MakeDumpDirectories( fileName );
            if( m_Config.UniqueFiles )
            {
                fileName = Utils::GetUniqueFileName(fileName);
            }

            m_MetricDump.open( fileName.c_str(), std::ios::out | std::ios::binary );

            m_pMDHelper->PrintMetricNames( m_MetricDump );
            m_pMDHelper->PrintMetricUnits( m_MetricDump );
        }
    }
}